

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O2

void NthElement(long N,long *StartSeed)

{
  long lVar1;
  ulong uVar2;
  
  if (0 < verbose) {
    NthElement::ln = NthElement::ln + 1;
    if (NthElement::ln % 1000 == 0) {
      fprintf(_stderr,"%c\b",(ulong)(uint)(int)"|/-\\"[NthElement::ln % 4]);
    }
  }
  lVar1 = *StartSeed;
  uVar2 = 0x41a7;
  for (; 0 < N; N = (ulong)N >> 1) {
    if ((N & 1U) != 0) {
      lVar1 = (long)(lVar1 * uVar2) % 0x7fffffff;
    }
    uVar2 = (uVar2 * uVar2) % 0x7fffffff;
  }
  *StartSeed = lVar1;
  return;
}

Assistant:

void NthElement (DSS_HUGE N, DSS_HUGE *StartSeed)
   {
   DSS_HUGE Z;
   DSS_HUGE Mult;
   static int ln=-1;
   int i;

   if ((verbose > 0) && ++ln % 1000 == 0)
       {
       i = ln % LN_CNT;
       fprintf(stderr, "%c\b", lnoise[i]);
       }
   Mult = Multiplier;
   Z = (DSS_HUGE) *StartSeed;
   while (N > 0 )
      {
      if (N % 2 != 0)    /* testing for oddness, this seems portable */
         Z = (Mult * Z) % Modulus;
      N = N / 2;         /* integer division, truncates */
      Mult = (Mult * Mult) % Modulus;
      }
   *StartSeed = Z;

   return;
   }